

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall UtilTest_filename_Test::TestBody(UtilTest_filename_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char8_t *in_ntstring;
  char16_t *in_ntstring_00;
  char32_t *in_ntstring_01;
  wchar_t *in_ntstring_02;
  AssertHelper local_150 [8];
  Message local_148 [8];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_140;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_130;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108 [8];
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_100;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_f0;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8 [8];
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_c0;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_b0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_80;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_70;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [24];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  UtilTest_filename_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  pcVar2 = jessilib::impl::filename_from_string<char,122ul>
                     ((char (*) [122])
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                     );
  local_30 = jessilib::make_string_view<char>(pcVar2);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_20,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"\"util.cpp\"",&local_30,(char (*) [9])0x687223);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  in_ntstring = jessilib::impl::filename_from_string<char8_t,122ul>
                          ((char8_t (*) [122])
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                          );
  local_70 = jessilib::make_string_view<char8_t>(in_ntstring);
  local_80 = sv("util.cpp",8);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_nullptr>
            ((EqHelper *)local_60,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(u8\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"u8\"util.cpp\"sv",&local_70,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  in_ntstring_00 =
       jessilib::impl::filename_from_string<char16_t,122ul>
                 ((char16_t (*) [122])
                  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                 );
  local_b0 = jessilib::make_string_view<char16_t>(in_ntstring_00);
  local_c0 = sv(L"util.cpp",8);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_nullptr>
            ((EqHelper *)local_a0,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(u\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"u\"util.cpp\"sv",&local_b0,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  in_ntstring_01 =
       jessilib::impl::filename_from_string<char32_t,122ul>
                 ((char32_t (*) [122])
                  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                 );
  local_f0 = jessilib::make_string_view<char32_t>(in_ntstring_01);
  local_100 = sv(L"util.cpp",8);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_nullptr>
            ((EqHelper *)local_e0,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(U\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"U\"util.cpp\"sv",&local_f0,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  in_ntstring_02 =
       jessilib::impl::filename_from_string<wchar_t,122ul>
                 ((wchar_t (*) [122])
                  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                 );
  local_130 = jessilib::make_string_view<wchar_t>(in_ntstring_02);
  local_140 = sv(L"util.cpp",8);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_nullptr>
            ((EqHelper *)local_120,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(L\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"L\"util.cpp\"sv",&local_130,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(local_150,local_148);
    testing::internal::AssertHelper::~AssertHelper(local_150);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  return;
}

Assistant:

TEST(UtilTest, filename) {
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(), "util.cpp");
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(u8), u8"util.cpp"sv);
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(u), u"util.cpp"sv);
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(U), U"util.cpp"sv);
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(L), L"util.cpp"sv);
	//EXPECT_EQ(JESSILIB_FILENAME(u8), u8".cpp"sv);
}